

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O0

void __thiscall
duckdb::ArrayColumnData::InitializeAppend(ArrayColumnData *this,ColumnAppendState *state)

{
  pointer __x;
  ColumnAppendState *in_RDI;
  ColumnAppendState child_append;
  ColumnAppendState validity_append;
  value_type *in_stack_ffffffffffffff68;
  undefined1 local_80 [88];
  ColumnAppendState *in_stack_ffffffffffffffd8;
  ColumnData *in_stack_ffffffffffffffe0;
  
  ColumnAppendState::ColumnAppendState(in_RDI);
  ColumnData::InitializeAppend(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::push_back
            ((vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_> *)in_RDI
             ,in_stack_ffffffffffffff68);
  ColumnAppendState::ColumnAppendState(in_RDI);
  __x = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                  ((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *)
                   in_RDI);
  (*__x->_vptr_ColumnData[0x11])(__x,local_80);
  ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::push_back
            ((vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_> *)in_RDI
             ,(value_type *)__x);
  ColumnAppendState::~ColumnAppendState(in_RDI);
  ColumnAppendState::~ColumnAppendState(in_RDI);
  return;
}

Assistant:

void ArrayColumnData::InitializeAppend(ColumnAppendState &state) {
	ColumnAppendState validity_append;
	validity.InitializeAppend(validity_append);
	state.child_appends.push_back(std::move(validity_append));

	ColumnAppendState child_append;
	child_column->InitializeAppend(child_append);
	state.child_appends.push_back(std::move(child_append));
}